

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_generateFromClonedModel_Test::TestBody(Clone_generateFromClonedModel_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertHelper local_1f0 [8];
  Message local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  shared_ptr local_1c0 [32];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  PrinterPtr p;
  Message local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  string local_148 [32];
  string local_128 [32];
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_e8 [8];
  GeneratorPtr generator;
  AnalyserPtr analyser;
  ModelPtr clonedModel;
  Message local_b0 [8];
  unsigned_long local_a8;
  char local_a0 [8];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Clone_generateFromClonedModel_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a0[0] = '\0';
  local_a0[1] = '\0';
  local_a0[2] = '\0';
  local_a0[3] = '\0';
  local_a0[4] = '\0';
  local_a0[5] = '\0';
  local_a0[6] = '\0';
  local_a0[7] = '\0';
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((AssertionResult *)local_98,(EqHelper<false> *)"size_t(0)","parser->issueCount()",
             local_a0,&local_a8,(unsigned_long *)in_R9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x1ec,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::clone();
  compareModel((shared_ptr *)local_30,
               (shared_ptr *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&generator.
                          super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar3);
  libcellml::Generator::create();
  peVar4 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Analyser::model();
  libcellml::Generator::setModel((shared_ptr *)peVar4);
  std::shared_ptr<libcellml::AnalyserModel>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserModel> *)&gtest_ar_1.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"generator/hodgkin_huxley_squid_axon_model_1952/model.c",&local_149);
  fileContents(local_128);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_e8);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_108,
             (EqHelper<false> *)
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.c\")",
             "generator->implementationCode()",(char *)local_128,&local_170,in_R9);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &p.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x1fa,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &p.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_178);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &p.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  libcellml::Printer::create();
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_2.message_);
  libcellml::Printer::printModel_abi_cxx11_(local_1c0,SUB81(peVar5,0));
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_2.message_);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_1e0,SUB81(peVar5,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_1a0,(EqHelper<false> *)"p->printModel(model)",
             "p->printModel(clonedModel)",(char *)local_1c0,&local_1e0,in_R9);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=(local_1f0,local_1e8);
    testing::internal::AssertHelper::~AssertHelper(local_1f0);
    testing::Message::~Message(local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Generator>::~shared_ptr((shared_ptr<libcellml::Generator> *)local_e8);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr
            ((shared_ptr<libcellml::Analyser> *)
             &generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Clone, generateFromClonedModel)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto clonedModel = model->clone();

    compareModel(model, clonedModel);

    libcellml::AnalyserPtr analyser = libcellml::Analyser::create();

    analyser->analyseModel(clonedModel);

    libcellml::GeneratorPtr generator = libcellml::Generator::create();

    generator->setModel(analyser->model());

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.c"), generator->implementationCode());

    libcellml::PrinterPtr p = libcellml::Printer::create();

    EXPECT_EQ(p->printModel(model), p->printModel(clonedModel));
}